

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObserver.cpp
# Opt level: O0

bool __thiscall test_CEObserver::test_set_atmoPars(test_CEObserver *this)

{
  byte bVar1;
  long lVar2;
  long *in_RDI;
  byte bVar3;
  double dVar4;
  double wavelength;
  double relHumidity;
  double pres;
  double temp_F;
  double temp_C;
  double temp_K;
  CEObserver obs;
  double old_tol;
  double *in_stack_fffffffffffffc58;
  undefined6 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc66;
  undefined1 in_stack_fffffffffffffc67;
  CEObserver *in_stack_fffffffffffffc88;
  allocator *paVar5;
  CEObserver *in_stack_fffffffffffffc90;
  undefined4 local_2d0;
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8 [32];
  undefined4 local_288;
  allocator local_281;
  string local_280 [32];
  double local_260;
  double local_258;
  undefined4 local_250;
  allocator local_249;
  string local_248 [32];
  double local_228;
  double local_220;
  undefined4 local_218;
  allocator local_211;
  string local_210 [32];
  double local_1f0;
  double local_1e8;
  undefined4 local_1e0;
  allocator local_1d9;
  string local_1d8 [32];
  double local_1b8;
  undefined4 local_1b0;
  allocator local_1a9;
  string local_1a8 [32];
  double local_188;
  undefined4 local_180;
  allocator local_179;
  string local_178 [32];
  double local_158;
  undefined4 local_150;
  allocator local_149;
  string local_148 [32];
  double local_128;
  undefined4 local_120;
  allocator local_119;
  string local_118 [32];
  double local_f8;
  double local_f0;
  double local_e8 [3];
  double local_d0 [7];
  CEObserver *in_stack_ffffffffffffff68;
  undefined8 local_18;
  undefined8 local_10 [2];
  
  local_10[0] = (**(code **)(*in_RDI + 0x20))();
  local_18 = 0x3da5fd7fe1796495;
  (**(code **)(*in_RDI + 0x30))(in_RDI,&local_18);
  CEObserver::CEObserver(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  local_d0[0] = CEObserver::Temperature_K((CEObserver *)0x11f1dd);
  local_d0[0] = local_d0[0] + 10.0;
  local_e8[0] = CppEphem::Temp_K2C(local_d0);
  local_f0 = CppEphem::Temp_K2F(local_d0);
  CEObserver::SetTemperature_K
            ((CEObserver *)
             CONCAT17(in_stack_fffffffffffffc67,
                      CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)),
             in_stack_fffffffffffffc58);
  local_f8 = CEObserver::Temperature_K((CEObserver *)0x11f27e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"test_set_atmoPars",&local_119);
  local_120 = 0xae;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_f8,local_d0,local_118,&local_120);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  local_128 = CEObserver::Temperature_C((CEObserver *)(local_d0 + 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"test_set_atmoPars",&local_149);
  local_150 = 0xaf;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_128,local_e8,local_148,&local_150);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  local_158 = CEObserver::Temperature_F((CEObserver *)0x11f3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"test_set_atmoPars",&local_179);
  local_180 = 0xb0;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_158,&local_f0,local_178,&local_180);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  local_f0 = local_f0 + 10.0;
  CEObserver::SetTemperature_F
            ((CEObserver *)
             CONCAT17(in_stack_fffffffffffffc67,
                      CONCAT16(in_stack_fffffffffffffc66,in_stack_fffffffffffffc60)),
             in_stack_fffffffffffffc58);
  local_188 = CEObserver::Temperature_F((CEObserver *)0x11f4d2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"test_set_atmoPars",&local_1a9);
  local_1b0 = 0xb5;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_188,&local_f0,local_1a8,&local_1b0);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  local_e8[0] = local_e8[0] + -10.0;
  CEObserver::SetTemperature_C((CEObserver *)(local_d0 + 1),local_e8);
  local_1b8 = CEObserver::Temperature_C((CEObserver *)(local_d0 + 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"test_set_atmoPars",&local_1d9);
  local_1e0 = 0xb8;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_1b8,local_e8,local_1d8,&local_1e0);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  local_1e8 = CEObserver::Pressure_hPa((CEObserver *)(local_d0 + 1));
  local_1e8 = local_1e8 + 10.0;
  CEObserver::SetPressure_hPa((CEObserver *)(local_d0 + 1),&local_1e8);
  local_1f0 = CEObserver::Pressure_hPa((CEObserver *)(local_d0 + 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"test_set_atmoPars",&local_211);
  local_218 = 0xbd;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_1f0,&local_1e8,local_210,&local_218);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  dVar4 = CEObserver::RelativeHumidity((CEObserver *)(local_d0 + 1));
  if ((dVar4 != 0.25) || (NAN(dVar4))) {
    local_220 = 0.25;
  }
  else {
    local_220 = 0.5;
  }
  CEObserver::SetRelativeHumidity((CEObserver *)(local_d0 + 1),&local_220);
  local_228 = CEObserver::RelativeHumidity((CEObserver *)(local_d0 + 1));
  paVar5 = &local_249;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"test_set_atmoPars",paVar5);
  local_250 = 199;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_228,&local_220,local_248,&local_250);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  local_258 = CEObserver::Wavelength_um((CEObserver *)(local_d0 + 1));
  local_258 = local_258 + 10.0;
  CEObserver::SetWavelength_um((CEObserver *)(local_d0 + 1),&local_258);
  local_260 = CEObserver::Wavelength_um((CEObserver *)(local_d0 + 1));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"test_set_atmoPars",&local_281);
  local_288 = 0xcc;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_260,&local_258,local_280,&local_288);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  CEObserver::print_abi_cxx11_(in_stack_ffffffffffffff68);
  lVar2 = std::__cxx11::string::size();
  bVar3 = lVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"test_set_atmoPars",&local_2c9);
  local_2d0 = 0xcf;
  (**(code **)(*in_RDI + 0x48))(in_RDI,bVar3 & 1,local_2c8,&local_2d0);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string(local_2a8);
  (**(code **)(*in_RDI + 0x30))(in_RDI,local_10);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  CEObserver::~CEObserver((CEObserver *)CONCAT17(bVar3,CONCAT16(bVar1,in_stack_fffffffffffffc60)));
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEObserver::test_set_atmoPars()
{
    // Cache the tolerance
    double old_tol(DblTol());
    SetDblTol(1.0e-11);

    // Create a copy with different values for testing
    CEObserver obs(base_obs_);

    // Test temperature
    double temp_K = obs.Temperature_K() + 10.0;
    double temp_C = CppEphem::Temp_K2C(temp_K);
    double temp_F = CppEphem::Temp_K2F(temp_K);
    obs.SetTemperature_K(temp_K);
    test_double(obs.Temperature_K(), temp_K, __func__, __LINE__);
    test_double(obs.Temperature_C(), temp_C, __func__, __LINE__);
    test_double(obs.Temperature_F(), temp_F, __func__, __LINE__);

    // Test Temperature setting
    temp_F += 10.0;
    obs.SetTemperature_F(temp_F);
    test_double(obs.Temperature_F(), temp_F, __func__, __LINE__);
    temp_C -= 10.0;
    obs.SetTemperature_C(temp_C);
    test_double(obs.Temperature_C(), temp_C, __func__, __LINE__);

    // Test pressure
    double pres = obs.Pressure_hPa() + 10.0;
    obs.SetPressure_hPa(pres);
    test_double(obs.Pressure_hPa(),  pres, __func__, __LINE__);

    // Test Relative humidity
    double relHumidity = obs.RelativeHumidity();
    if (relHumidity == 0.25) {
        relHumidity = 0.5;
    } else {
        relHumidity = 0.25;
    }
    obs.SetRelativeHumidity(relHumidity);
    test_double(obs.RelativeHumidity(),  relHumidity, __func__, __LINE__);
    
    // Test wavelength
    double wavelength = obs.Wavelength_um() + 10.0;
    obs.SetWavelength_um(wavelength);
    test_double(obs.Wavelength_um(), wavelength, __func__, __LINE__);

    // Make sure the print statement actually does something
    test(obs.print().size() > 0, __func__, __LINE__);

    // Reset the tolerance
    SetDblTol(old_tol);
    return pass();
}